

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O2

void __thiscall
duckdb::BuiltinFunctions::AddFunction(BuiltinFunctions *this,TableFunction *function)

{
  CreateTableFunctionInfo info;
  CreateTableFunctionInfo local_380;
  TableFunction local_1c8;
  
  TableFunction::TableFunction(&local_1c8,function);
  CreateTableFunctionInfo::CreateTableFunctionInfo(&local_380,&local_1c8);
  TableFunction::~TableFunction(&local_1c8);
  local_380.super_CreateFunctionInfo.super_CreateInfo.internal = true;
  Catalog::CreateTableFunction(this->catalog,this->transaction,&local_380);
  CreateTableFunctionInfo::~CreateTableFunctionInfo(&local_380);
  return;
}

Assistant:

void BuiltinFunctions::AddFunction(TableFunction function) {
	CreateTableFunctionInfo info(std::move(function));
	info.internal = true;
	catalog.CreateTableFunction(transaction, info);
}